

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

iterator __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
::find<std::__cxx11::string>
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<std::__cxx11::string,int>,std::function<unsigned_long(std::__cxx11::string_const&)>,phmap::EqualTo<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,int>>>
           *this,key_arg<std::__cxx11::basic_string<char>_> *key)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  iterator iVar3;
  
  if (*(long *)(this + 0x40) != 0) {
    uVar2 = (**(code **)(this + 0x48))(this + 0x30);
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar2;
    iVar3 = find<std::__cxx11::string>
                      (this,key,SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),8) +
                                SUB168(auVar1 * ZEXT816(0xde5fb9d2630458e9),0));
    return iVar3;
  }
  std::__throw_bad_function_call();
}

Assistant:

inline size_t HashSeed(const ctrl_t* ctrl) {
  // The low bits of the pointer have little or no entropy because of
  // alignment. We shift the pointer to try to use higher entropy bits. A
  // good number seems to be 12 bits, because that aligns with page size.
  return reinterpret_cast<uintptr_t>(ctrl) >> 12;
}